

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O0

void __thiscall
QSslKey::QSslKey(QSslKey *this,QByteArray *encoded,KeyAlgorithm algorithm,EncodingFormat encoding,
                KeyType type,QByteArray *passPhrase)

{
  QExplicitlySharedDataPointer<QSslKeyPrivate> *this_00;
  pointer pTVar1;
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  QSslKeyPrivate *in_RDI;
  uint in_R8D;
  undefined8 in_R9;
  TlsKey *tlsKey;
  QSslKeyPrivate *in_stack_ffffffffffffffb8;
  
  this_00 = (QExplicitlySharedDataPointer<QSslKeyPrivate> *)operator_new(0x10);
  QSslKeyPrivate::QSslKeyPrivate(in_RDI);
  QExplicitlySharedDataPointer<QSslKeyPrivate>::QExplicitlySharedDataPointer
            (this_00,in_stack_ffffffffffffffb8);
  QExplicitlySharedDataPointer<QSslKeyPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSslKeyPrivate> *)0x39e0ce);
  pTVar1 = std::unique_ptr<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>::get
                     ((unique_ptr<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_> *)
                      0x39e0d6);
  if (pTVar1 != (pointer)0x0) {
    if (in_ECX == 1) {
      (*pTVar1->_vptr_TlsKey[2])(pTVar1,(ulong)in_R8D,(ulong)in_EDX,in_RSI,in_R9,1);
    }
    else {
      (*pTVar1->_vptr_TlsKey[3])(pTVar1,(ulong)in_R8D,(ulong)in_EDX,in_RSI,in_R9,1);
    }
  }
  return;
}

Assistant:

QSslKey::QSslKey(const QByteArray &encoded, QSsl::KeyAlgorithm algorithm,
                 QSsl::EncodingFormat encoding, QSsl::KeyType type, const QByteArray &passPhrase)
    : d(new QSslKeyPrivate)
{
    if (auto *tlsKey = d->backend.get()) {
        if (encoding == QSsl::Der)
            tlsKey->decodeDer(type, algorithm, encoded, passPhrase, true /*deep clear*/);
        else
            tlsKey->decodePem(type, algorithm, encoded, passPhrase, true /*deep clear*/);
    }
}